

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DancingNode.cpp
# Opt level: O1

void cover(DancingNode *targetDancingNode,
          vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
          *Matrix)

{
  int *piVar1;
  s_DancingNode *psVar2;
  pointer pvVar3;
  long lVar4;
  s_DancingNode *psVar5;
  s_DancingNode *psVar6;
  s_DancingNode *psVar7;
  
  psVar2 = targetDancingNode->column;
  psVar6 = psVar2->left;
  psVar6->right = psVar2->right;
  psVar2->right->left = psVar6;
  psVar6 = psVar2->down;
  if (psVar6 != psVar2) {
    pvVar3 = (Matrix->
             super__Vector_base<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    do {
      psVar7 = psVar6->right;
      if (psVar7 != psVar6) {
        lVar4 = *(long *)&(pvVar3->super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>
                          )._M_impl.super__Vector_impl_data;
        do {
          psVar5 = psVar7->up;
          psVar5->down = psVar7->down;
          psVar7->down->up = psVar5;
          piVar1 = (int *)(lVar4 + 0x30 + (long)psVar7->col * 0x38);
          *piVar1 = *piVar1 + -1;
          psVar7 = psVar7->right;
        } while (psVar7 != psVar6);
      }
      psVar6 = psVar6->down;
    } while (psVar6 != psVar2);
  }
  return;
}

Assistant:

void cover(DancingNode *targetDancingNode, vector<vector<DancingNode>> &Matrix) 
{ 
    DancingNode *row, *rightDancingNode; 
  
    // get the pointer to the header of column 
    // to which this node belong  
    DancingNode *colDancingNode = targetDancingNode->column; 
  
    // unlink column header from it's neighbors 
    colDancingNode->left->right = colDancingNode->right; 
    colDancingNode->right->left = colDancingNode->left; 
  
    // Move down the column and remove each row 
    // by traversing right 
    for(row = colDancingNode->down; row != colDancingNode; row = row->down) 
    { 
        for(rightDancingNode = row->right; rightDancingNode != row; 
            rightDancingNode = rightDancingNode->right) 
        { 
            rightDancingNode->up->down = rightDancingNode->down; 
            rightDancingNode->down->up = rightDancingNode->up; 
  
            // after unlinking row node, decrement the 
            // node count in column header 
            Matrix[0][rightDancingNode->col].nodeCount -= 1; 
        } 
    } 
}